

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

bool __thiscall ON_PolyEdgeCurve::Prepend(ON_PolyEdgeCurve *this,ON_PolyEdgeSegment *new_segment)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  ON_Interval sdom;
  ON_Interval cdom;
  ON_Interval local_40;
  ON_Interval local_30;
  
  (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x17])(this,1);
  if (new_segment == (ON_PolyEdgeSegment *)0x0) {
    bVar2 = false;
  }
  else {
    iVar3 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    if (0 < iVar3) {
      (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])(this);
      (*(new_segment->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x25])(new_segment);
      pdVar4 = ON_Interval::operator[](&local_40,1);
      dVar1 = *pdVar4;
      pdVar4 = ON_Interval::operator[](&local_30,0);
      if ((dVar1 != *pdVar4) || (NAN(dVar1) || NAN(*pdVar4))) {
        pdVar4 = ON_Interval::operator[](&local_30,0);
        dVar1 = *pdVar4;
        dVar5 = ON_Interval::Length(&local_40);
        pdVar4 = ON_Interval::operator[](&local_40,0);
        *pdVar4 = dVar1 - dVar5;
        pdVar4 = ON_Interval::operator[](&local_30,0);
        dVar1 = *pdVar4;
        pdVar4 = ON_Interval::operator[](&local_40,1);
        *pdVar4 = dVar1;
        pdVar4 = ON_Interval::operator[](&local_40,0);
        dVar1 = *pdVar4;
        pdVar4 = ON_Interval::operator[](&local_40,1);
        (*(new_segment->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(dVar1,*pdVar4,new_segment);
      }
    }
    bVar2 = ON_PolyCurve::Prepend(&this->super_ON_PolyCurve,(ON_Curve *)new_segment);
  }
  return bVar2;
}

Assistant:

bool ON_PolyEdgeCurve::Prepend( ON_PolyEdgeSegment* new_segment )
{
  DestroyRuntimeCache();
  bool rc = false;
  if ( new_segment )
  {
    if ( Count() > 0 )
    {
      // keep segment domains in synch with polycurve domain
      // so that parameter bookkeeping is easy.
      ON_Interval cdom = Domain();
      ON_Interval sdom = new_segment->Domain();
      if ( sdom[1] != cdom[0] )
      {
        sdom[0] = cdom[0] - sdom.Length();
        sdom[1] = cdom[0];
        new_segment->SetDomain(sdom[0],sdom[1]);
      }
    }
    rc = ON_PolyCurve::Prepend(new_segment);
  }
  return rc;
}